

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions.hpp
# Opt level: O0

size_t std::experimental::detail::index_into_dynamic_dims<int,unsigned_long,unsigned_long>
                 (int idx,unsigned_long head,unsigned_long tail)

{
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_24;
  unsigned_long tail_local;
  unsigned_long head_local;
  int idx_local;
  
  if ((head == 0xffffffffffffffff) && (idx != 0)) {
    if (idx == 0) {
      local_24 = 0;
    }
    else {
      local_24 = idx + -1;
    }
    local_30 = index_into_dynamic_dims<int,unsigned_long>(local_24,tail);
    local_30 = local_30 + 1;
  }
  else {
    if (idx == 0) {
      local_34 = 0;
    }
    else {
      local_34 = idx + -1;
    }
    local_30 = index_into_dynamic_dims<int,unsigned_long>(local_34,tail);
  }
  return local_30;
}

Assistant:

inline constexpr std::size_t index_into_dynamic_dims(
    Idx idx, Head head, Tail... tail
    ) noexcept
{
    return
        // FIXME: Is idx != 0 needed
        ( head == dyn && idx != 0
        ? index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...) + 1
        : index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...)
        );
}